

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractbutton.cpp
# Opt level: O2

bool __thiscall QAbstractButton::event(QAbstractButton *this,QEvent *e)

{
  ushort uVar1;
  long lVar2;
  bool bVar3;
  FocusPolicy FVar4;
  QWidget *this_00;
  uint uVar5;
  
  uVar1 = *(ushort *)(e + 8);
  if ((((this->super_QWidget).data)->widget_attributes & 1) == 0) {
    if (uVar1 != 0x75) goto LAB_0039c20b;
LAB_0039c19b:
    lVar2 = *(long *)&(this->super_QWidget).field_0x8;
    if (*(int *)(lVar2 + 0x288) == *(int *)(e + 0x18)) {
      if (e[0x1c] == (QEvent)0x0) {
        bVar3 = true;
        if (*(int *)(lVar2 + 0x29c) == 0) {
          animateClick(this);
        }
      }
      else {
        FVar4 = QWidget::focusPolicy(&this->super_QWidget);
        if (FVar4 != NoFocus) {
          QWidget::setFocus(&this->super_QWidget,ShortcutFocusReason);
        }
        this_00 = QWidget::window(&this->super_QWidget);
        QWidget::setAttribute(this_00,WA_KeyboardFocusChange,true);
        bVar3 = true;
      }
    }
    else {
      bVar3 = false;
    }
  }
  else {
    bVar3 = true;
    uVar5 = uVar1 - 0x52;
    if (uVar5 < 0x30) {
      if ((0xe00000000c21U >> ((ulong)uVar5 & 0x3f) & 1) != 0) {
        return true;
      }
      if ((ulong)uVar5 == 0x23) goto LAB_0039c19b;
    }
    if (3 < uVar1 - 2) {
LAB_0039c20b:
      bVar3 = QWidget::event(&this->super_QWidget,e);
      return bVar3;
    }
  }
  return bVar3;
}

Assistant:

bool QAbstractButton::event(QEvent *e)
{
    // as opposed to other widgets, disabled buttons accept mouse
    // events. This avoids surprising click-through scenarios
    if (!isEnabled()) {
        switch(e->type()) {
        case QEvent::TabletPress:
        case QEvent::TabletRelease:
        case QEvent::TabletMove:
        case QEvent::MouseButtonPress:
        case QEvent::MouseButtonRelease:
        case QEvent::MouseButtonDblClick:
        case QEvent::MouseMove:
        case QEvent::HoverMove:
        case QEvent::HoverEnter:
        case QEvent::HoverLeave:
        case QEvent::ContextMenu:
            return true;
        default:
            break;
        }
    }

#ifndef QT_NO_SHORTCUT
    if (e->type() == QEvent::Shortcut) {
        Q_D(QAbstractButton);
        QShortcutEvent *se = static_cast<QShortcutEvent *>(e);
        if (d->shortcutId != se->shortcutId())
            return false;
        if (!se->isAmbiguous()) {
            if (!d->animateTimer.isActive())
                animateClick();
        } else {
            if (focusPolicy() != Qt::NoFocus)
                setFocus(Qt::ShortcutFocusReason);
            window()->setAttribute(Qt::WA_KeyboardFocusChange);
        }
        return true;
    }
#endif
    return QWidget::event(e);
}